

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

string * __thiscall
cppcms::json::value::get<std::__cxx11::string>
          (value *this,char *path,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *def)

{
  ulong uVar1;
  string *in_RCX;
  char *in_RSI;
  string *in_RDI;
  bad_cast *e;
  value *v;
  value *in_stack_ffffffffffffffa8;
  
  cppcms::json::value::find(in_RSI);
  uVar1 = cppcms::json::value::is_undefined();
  if ((uVar1 & 1) == 0) {
    get_value<std::__cxx11::string>(in_stack_ffffffffffffffa8);
  }
  else {
    std::__cxx11::string::string(in_RDI,in_RCX);
  }
  return in_RDI;
}

Assistant:

T get(char const *path,T const &def) const
		{
			value const &v=find(path);
			if(v.is_undefined())
				return def;
			try {
				return v.get_value<T>();
			}
			catch(std::bad_cast const &e) {
				return def;
			}
		}